

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall asl::File::hasExtension(File *this,String *extensions)

{
  int iVar1;
  bool bVar2;
  String *s;
  long lVar3;
  long lVar4;
  Array<asl::String> exts;
  String local_50;
  String ext;
  
  String::toLowerCase(&ext,extensions);
  String::String(&local_50,'|');
  String::split((String *)&exts,&ext);
  String::~String(&local_50);
  String::~String(&ext);
  extension(&local_50,this);
  String::toLowerCase(&ext,&local_50);
  String::~String(&local_50);
  lVar3 = -1;
  lVar4 = 0;
  do {
    iVar1 = *(int *)&exts._a[-1].field_2;
    lVar3 = lVar3 + 1;
    if (iVar1 <= lVar3) break;
    s = (String *)((long)&(exts._a)->_size + lVar4);
    lVar4 = lVar4 + 0x18;
    bVar2 = String::operator==(&ext,s);
  } while (!bVar2);
  String::~String(&ext);
  Array<asl::String>::~Array(&exts);
  return lVar3 < iVar1;
}

Assistant:

bool File::hasExtension(const String& extensions) const
{
	Array<String> exts = extensions.toLowerCase().split('|');
	String ext = extension().toLowerCase();
	for (int i = 0; i < exts.length(); i++)
		if (ext == exts[i])
			return true;
	return false;
}